

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitGotoStatement(SyntaxDumper *this,GotoStatementSyntax *node)

{
  GotoStatementSyntax local_50 [56];
  
  GotoStatementSyntax::gotoKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x20));
  GotoStatementSyntax::semicolonToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  return Skip;
}

Assistant:

virtual Action visitGotoStatement(const GotoStatementSyntax* node) override
    {
        terminal(node->gotoKeyword(), node);
        nonterminal(node->expression());
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }